

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vars3.c
# Opt level: O0

cadr_cell cadr(LispPTR cell_adr)

{
  cadr_cell cVar1;
  short sVar2;
  LispPTR *pLVar3;
  LispPTR *pLStack_20;
  short offset;
  ConsCell *pcons;
  LispPTR LStack_10;
  LispPTR cell_adr_local;
  cadr_cell cadr1;
  
  if ((*(ushort *)((ulong)(MDStypetbl + (cell_adr >> 9)) ^ 2) & 0x7ff) == 5) {
    pLStack_20 = NativeAligned4FromLAddr(cell_adr);
    pcons._4_4_ = cell_adr;
    for (; *pLStack_20 >> 0x1c == 0; pLStack_20 = NativeAligned4FromLAddr(*pLStack_20 & 0xfffffff))
    {
      pcons._4_4_ = *pLStack_20 & 0xfffffff;
    }
    LStack_10 = *pLStack_20 & 0xfffffff;
    if (*pLStack_20 >> 0x1c == 8) {
      cell_adr_local = 0;
    }
    else {
      sVar2 = (short)((*pLStack_20 >> 0x1c & 7) << 1);
      if (*pLStack_20 >> 0x1c < 9) {
        pLVar3 = NativeAligned4FromLAddr(pcons._4_4_ + (int)sVar2);
        cell_adr_local = *pLVar3 & 0xfffffff;
      }
      else {
        cell_adr_local = pcons._4_4_ + (int)sVar2;
      }
    }
  }
  else if (cell_adr == 0) {
    LStack_10 = 0;
    cell_adr_local = 0;
  }
  else {
    LStack_10 = car(cell_adr);
    cell_adr_local = cdr(cell_adr);
  }
  cVar1.cdr_cell = cell_adr_local;
  cVar1.car_cell = LStack_10;
  return cVar1;
}

Assistant:

struct cadr_cell cadr(LispPTR cell_adr)
/* address of cell */
/* Lisp address (word addressing) */
{
  ConsCell *pcons;
  struct cadr_cell cadr1; /* return value */
  short offset;

  if (Listp(cell_adr) == NIL) {
    if (cell_adr == NIL) {
      cadr1.car_cell = 0;
      cadr1.cdr_cell = 0;
      return (cadr1);
    } else {
      cadr1.car_cell = car(cell_adr);
      cadr1.cdr_cell = cdr(cell_adr);
      return (cadr1);
    }
  }
  pcons = (ConsCell *)NativeAligned4FromLAddr(cell_adr);
  while (pcons->cdr_code == CDR_INDIRECT) {
    /* CDR indirect */
    cell_adr = pcons->car_field;
    pcons = (ConsCell *)NativeAligned4FromLAddr(pcons->car_field);
  } /* skip CDR_INDIRECT cell */

  cadr1.car_cell = pcons->car_field;

  if (pcons->cdr_code == CDR_NIL) {
    /* CDR nil */
    cadr1.cdr_cell = NIL_PTR;
    return (cadr1);
  }
#ifdef NEWCDRCODING
  offset = (0x7 & pcons->cdr_code) << 1;
  if (pcons->cdr_code > CDR_NIL) {
    /* CDR on page */
    cadr1.cdr_cell = cell_adr + offset;
  } else {
    /* CDR different page */
    pcons = (ConsCell *)NativeAligned4FromLAddr((cell_adr) + offset);
    cadr1.cdr_cell = pcons->car_field;
  }
#else
  offset = (0x7F & pcons->cdr_code) << 1;
  if (pcons->cdr_code > CDR_NIL) {
    /* CDR on page */
    cadr1.cdr_cell = (mPAGEMASK & cell_adr) | offset;
  } else {
    /* CDR different page */
    pcons = (ConsCell *)NativeAligned4FromLAddr(((mPAGEMASK & cell_adr) | offset));
    cadr1.cdr_cell = pcons->car_field;
  }
#endif /* NEWCDRCODING */

  return (cadr1);
}